

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

string * __thiscall
ObjectModelBuilder::uniqueIdentifier
          (string *__return_storage_ptr__,ObjectModelBuilder *this,Class *clazz,string *id)

{
  size_type *psVar1;
  size_type *psVar2;
  uint uVar3;
  size_type sVar4;
  uint __val;
  undefined8 uVar5;
  uint uVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  pointer pcVar10;
  uint __len;
  size_type *local_70;
  string __str;
  long local_48;
  pointer local_40 [2];
  
  sVar4 = id->_M_string_length;
  if (sVar4 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = (id->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar4);
    return __return_storage_ptr__;
  }
  this->m_unnamedCounter = this->m_unnamedCounter + 1;
  __str.field_2._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"unnamable","");
  uVar3 = this->m_unnamedCounter;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0010b9bc;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0010b9bc;
      }
      if (uVar8 < 10000) goto LAB_0010b9bc;
      uVar9 = uVar9 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_0010b9bc:
  psVar1 = &__str._M_string_length;
  local_70 = psVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_70),__len,__val);
  pcVar10 = (pointer)0xf;
  if ((pointer *)__str.field_2._8_8_ != local_40) {
    pcVar10 = local_40[0];
  }
  if (pcVar10 < __str._M_dataplus._M_p + local_48) {
    pcVar10 = (pointer)0xf;
    if (local_70 != psVar1) {
      pcVar10 = (pointer)__str._M_string_length;
    }
    if (__str._M_dataplus._M_p + local_48 <= pcVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,__str.field_2._8_8_);
      goto LAB_0010ba42;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append(__str.field_2._M_local_buf + 8,(ulong)local_70);
LAB_0010ba42:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar2) {
    uVar5 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_70 != psVar1) {
    operator_delete(local_70);
  }
  if ((pointer *)__str.field_2._8_8_ != local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectModelBuilder::uniqueIdentifier(Class *clazz, const std::string &id)
{
    if (id.empty()) {
        ++m_unnamedCounter;
        return std::string("unnamable") + std::to_string(m_unnamedCounter);
    }
    return id;
}